

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

PropertyInstance *
anon_unknown.dwarf_9dafb2::GetProperty<Assimp::PLY::PropertyInstance>
          (vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
           *props,int idx)

{
  pointer pPVar1;
  long lVar2;
  DeadlyImportError *this;
  ulong uVar3;
  allocator<char> local_39;
  string local_38;
  
  uVar3 = (ulong)idx;
  pPVar1 = (props->
           super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(props->
                super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1;
  if (uVar3 < (ulong)(lVar2 / 0x18)) {
    return pPVar1 + uVar3;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10,uVar3,lVar2 % 0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid .ply file: Property index is out of range.",&local_39);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
    const T &GetProperty(const std::vector<T> &props, int idx) {
        if (static_cast<size_t>(idx) >= props.size()) {
            throw DeadlyImportError("Invalid .ply file: Property index is out of range.");
        }

        return props[idx];
    }